

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O2

int32_t adt_utf8_readCodePoint(uint8_t *strBuf,int32_t bufLen,int *codePoint)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  
  if ((codePoint == (int *)0x0 || strBuf == (uint8_t *)0x0) || bufLen < 0) {
    return -1;
  }
  bVar1 = *strBuf;
  uVar3 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    uVar5 = (uint)bVar1;
    if ((uVar3 & 0xffffffe0) == 0xc0) {
      uVar3 = uVar3 & 0x1f;
      uVar5 = 2;
    }
    else if ((uVar5 & 0xfffffff0) == 0xe0) {
      uVar3 = uVar3 & 0xf;
      uVar5 = 3;
    }
    else {
      if ((uVar5 & 0xfffffff8) != 0xf0) {
        return 0;
      }
      uVar3 = uVar5 & 7;
      uVar5 = 4;
    }
  }
  else {
    uVar5 = 1;
  }
  uVar2 = uVar5;
  if ((uint)bufLen < uVar5) {
    return 0;
  }
  pbVar4 = strBuf + 1;
  while( true ) {
    if ((int)uVar5 < 2) {
      *codePoint = uVar3;
      return uVar2;
    }
    if ((*pbVar4 & 0xffffffc0) != 0x80) break;
    uVar3 = uVar3 << 6 | *pbVar4 & 0x3f;
    pbVar4 = pbVar4 + 1;
    uVar5 = uVar5 - 1;
  }
  return -2;
}

Assistant:

DYN_STATIC int32_t adt_utf8_readCodePoint(const uint8_t *strBuf, int32_t bufLen, int *codePoint)
{
   int tmp = 0;
   int32_t retval = 0;
   if ( (strBuf == 0) || (bufLen < 0) || (codePoint == 0) )
   {
      return ADT_UTF8_INVALID_ARGUMENT;
   }
   if (bufLen > 0)
   {
      int32_t expectedLen = 0;
      uint8_t c = (uint8_t) *strBuf++;
      if (c < 128u)
      {
         expectedLen = 1;
         tmp = c;
      }
      else if ( ( (c & 0xe0) == 0xc0) )
      {
         expectedLen = 2;
         tmp = c & 0x1F;

      }
      else if ( ( (c & 0xf0) == 0xe0) )
      {
         expectedLen = 3;
         tmp = c & 0x0F;
      }
      else if ( ( (c & 0xf8) == 0xf0) )
      {
         expectedLen = 4;
         tmp = c & 0x07;
      }
      else
      {
         retval = ADT_UTF8_INVALID_ENCODING;
      }
      if ( expectedLen > 0 )
      {
         if (bufLen >= expectedLen)
         {
            retval = expectedLen--;
            while(expectedLen > 0)
            {
               c = (uint8_t) *strBuf++;
               if ( ( (c & 0xc0) != 0x80) )
               {
                  retval = ADT_UTF8_INVALID_ENCODING;
                  break;
               }
               tmp <<= 6;
               tmp |= c & 0x3F;
               --expectedLen;
            }
         }
      }
      else
      {
         retval = 0; //not enough bytes in buffer, try again later
      }
   }
   if (retval > 0)
   {
      *codePoint = tmp;
   }
   return retval;
}